

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_line<charls::transform_hp1<unsigned_short>::inverse,unsigned_short>
               (quad<unsigned_short> *destination,quad<unsigned_short> *source,size_t pixel_count,
               inverse *transform)

{
  ushort uVar1;
  size_t sVar2;
  
  if (pixel_count != 0) {
    sVar2 = 0;
    do {
      uVar1 = source[sVar2].super_triplet<unsigned_short>.field_1.v2;
      destination[sVar2] =
           (quad<unsigned_short>)
           ((ulong)source[sVar2].field_0.v4 << 0x30 |
           (ulong)((ushort)(source[sVar2].super_triplet<unsigned_short>.field_0.v1 + uVar1) ^ 0x8000
                  ) |
           (ulong)uVar1 << 0x10 |
           (ulong)((ushort)(source[sVar2].super_triplet<unsigned_short>.field_2.v3 + uVar1) ^ 0x8000
                  ) << 0x20);
      sVar2 = sVar2 + 1;
    } while (pixel_count != sVar2);
  }
  return;
}

Assistant:

void transform_line(quad<PixelType>* destination, const quad<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = quad<PixelType>(transform(source[i].v1, source[i].v2, source[i].v3), source[i].v4);
    }
}